

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O0

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)0>::Move_iterator::size
          (Move_iterator *this)

{
  size_type sVar1;
  lock_guard<std::mutex> local_18;
  Guard_t g;
  Move_iterator *this_local;
  
  g._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,this->mtx_);
  sVar1 = std::
          vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
          ::size(this->events_);
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return sVar1;
}

Assistant:

auto size() const -> Size_t
            {
                Guard_t g{mtx_};
                return events_.size();
            }